

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::createRecursively(QWidgetPrivate *this)

{
  bool bVar1;
  QWidgetPrivate *this_00;
  QWidget *this_01;
  qsizetype qVar2;
  QWidget *pQVar3;
  QWidgetPrivate *in_RDI;
  QWidget *child;
  int i;
  QWidget *q;
  QObject *in_stack_ffffffffffffffc8;
  int local_14;
  
  this_00 = (QWidgetPrivate *)q_func(in_RDI);
  QWidget::create((QWidget *)this,(WId)q,i._3_1_,i._2_1_);
  local_14 = 0;
  while( true ) {
    this_01 = (QWidget *)(long)local_14;
    qVar2 = QList<QObject_*>::size((QList<QObject_*> *)&in_RDI->field_0x18);
    if (qVar2 <= (long)this_01) break;
    QList<QObject_*>::at((QList<QObject_*> *)this_01,(qsizetype)in_stack_ffffffffffffffc8);
    pQVar3 = qobject_cast<QWidget*>(in_stack_ffffffffffffffc8);
    if (pQVar3 != (QWidget *)0x0) {
      bVar1 = QWidget::isHidden((QWidget *)0x35e3a5);
      if (!bVar1) {
        bVar1 = QWidget::isWindow(this_01);
        if (!bVar1) {
          bVar1 = QWidget::testAttribute
                            ((QWidget *)in_RDI,(WidgetAttribute)((ulong)this_01 >> 0x20));
          if (!bVar1) {
            QWidget::d_func((QWidget *)0x35e3d4);
            createRecursively(this_00);
          }
        }
      }
    }
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void QWidgetPrivate::createRecursively()
{
    Q_Q(QWidget);
    q->create(0, true, true);
    for (int i = 0; i < children.size(); ++i) {
        QWidget *child = qobject_cast<QWidget *>(children.at(i));
        if (child && !child->isHidden() && !child->isWindow() && !child->testAttribute(Qt::WA_WState_Created))
            child->d_func()->createRecursively();
    }
}